

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetChaseThreshold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  int iVar4;
  char *pcVar5;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003f039d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f038d:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f039d:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1956,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003f02e4;
    bVar2 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f039d;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003f038d;
LAB_003f02e4:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_003f03c5:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1957,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_003f03c5;
  }
  iVar1 = param[1].field_0.i;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003f03ed;
    }
    bVar2 = param[2].field_0.i == 0;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003f03ed:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1958,
                    "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar2 = param[2].field_0.i == 0;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003f0350;
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f040c;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003f0350:
    pAVar3 = COPY_AAPTR(pAVar3,param[3].field_0.i);
    if (pAVar3 != (AActor *)0x0) {
      iVar4 = 0;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      if (bVar2) {
        pAVar3->threshold = iVar4;
      }
      else {
        pAVar3->DefThreshold = iVar4;
      }
    }
    return 0;
  }
  pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f040c:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1959,
                "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetChaseThreshold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(threshold);
	PARAM_BOOL_DEF(def);
	PARAM_INT_DEF(ptr);


	AActor *mobj = COPY_AAPTR(self, ptr);
	if (!mobj)
	{
		return 0;
	}
	if (def)
		mobj->DefThreshold = (threshold >= 0) ? threshold : 0;
	else
		mobj->threshold = (threshold >= 0) ? threshold : 0;
	return 0;
}